

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

uint64_t uv__read_proc_meminfo(char *what)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char local_1038 [8];
  char buf [4096];
  int fd;
  char *p;
  ssize_t n;
  uint64_t rc;
  char *what_local;
  
  n = 0;
  rc = (uint64_t)what;
  buf._4092_4_ = uv__open_cloexec("/proc/meminfo",0);
  if ((int)buf._4092_4_ < 0) {
    what_local = (char *)0x0;
  }
  else {
    sVar2 = read(buf._4092_4_,local_1038,0xfff);
    if (0 < sVar2) {
      local_1038[sVar2] = '\0';
      pcVar3 = strstr(local_1038,(char *)rc);
      if (pcVar3 != (char *)0x0) {
        sVar4 = strlen((char *)rc);
        iVar1 = sscanf(pcVar3 + sVar4,"%lu kB",&n);
        if (iVar1 == 1) {
          n = n << 10;
        }
      }
    }
    iVar1 = uv__close_nocheckstdio(buf._4092_4_);
    if (iVar1 != 0) {
      abort();
    }
    what_local = (char *)n;
  }
  return (uint64_t)what_local;
}

Assistant:

static uint64_t uv__read_proc_meminfo(const char* what) {
  uint64_t rc;
  ssize_t n;
  char* p;
  int fd;
  char buf[4096];  /* Large enough to hold all of /proc/meminfo. */

  rc = 0;
  fd = uv__open_cloexec("/proc/meminfo", O_RDONLY);

  if (fd < 0)
    return 0;

  n = read(fd, buf, sizeof(buf) - 1);

  if (n <= 0)
    goto out;

  buf[n] = '\0';
  p = strstr(buf, what);

  if (p == NULL)
    goto out;

  p += strlen(what);

  if (1 != sscanf(p, "%" PRIu64 " kB", &rc))
    goto out;

  rc *= 1024;

out:

  if (uv__close_nocheckstdio(fd))
    abort();

  return rc;
}